

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

void __thiscall iDynTree::SubModelDecomposition::~SubModelDecomposition(SubModelDecomposition *this)

{
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *unaff_retaddr;
  size_t in_stack_00000028;
  SubModelDecomposition *in_stack_00000030;
  
  setNrOfSubModels(in_stack_00000030,in_stack_00000028);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::~vector(unaff_retaddr)
  ;
  return;
}

Assistant:

SubModelDecomposition::~SubModelDecomposition()
{
    this->setNrOfSubModels(0);
}